

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void __thiscall
flatbuffers::JsonPrinter::GenField<unsigned_short>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  voffset_t field;
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short *puVar3;
  _Optional_payload_base<unsigned_short> local_2c;
  int local_28;
  Optional<unsigned_short> opt;
  int indent_local;
  bool fixed_local;
  Table *table_local;
  FieldDef *fd_local;
  JsonPrinter *this_local;
  
  local_28 = indent;
  opt.super__Optional_base<unsigned_short,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_short>._3_1_ = fixed;
  if (fixed) {
    uVar2 = Struct::GetField<unsigned_short>((Struct *)table,(uint)(fd->value).offset);
    PrintScalar<unsigned_short>(this,uVar2,&(fd->value).type,local_28);
  }
  else {
    bVar1 = FieldDef::IsOptional(fd);
    if (bVar1) {
      local_2c = (_Optional_payload_base<unsigned_short>)
                 Table::GetOptional<unsigned_short,unsigned_short>(table,(fd->value).offset);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_2c);
      if (bVar1) {
        puVar3 = std::optional<unsigned_short>::operator*((optional<unsigned_short> *)&local_2c);
        PrintScalar<unsigned_short>(this,*puVar3,&(fd->value).type,local_28);
      }
      else {
        std::__cxx11::string::operator+=((string *)this->text,"null");
      }
    }
    else {
      field = (fd->value).offset;
      uVar2 = GetFieldDefault<unsigned_short>(fd);
      uVar2 = Table::GetField<unsigned_short>(table,field,uVar2);
      PrintScalar<unsigned_short>(this,uVar2,&(fd->value).type,local_28);
    }
  }
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }